

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QToolBarAreaLayoutItem> * __thiscall
QList<QToolBarAreaLayoutItem>::mid
          (QList<QToolBarAreaLayoutItem> *__return_storage_ptr__,QList<QToolBarAreaLayoutItem> *this
          ,qsizetype pos,qsizetype len)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  CutResult CVar3;
  QToolBarAreaLayoutItem *__dest;
  longlong lVar4;
  long in_FS_OFFSET;
  qsizetype l;
  qsizetype p;
  QArrayData *d;
  longlong local_48;
  qsizetype local_40;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = len;
  local_40 = pos;
  CVar3 = QtPrivate::QContainerImplHelper::mid((this->d).size,&local_40,&local_48);
  if (CVar3 < Full) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QToolBarAreaLayoutItem *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if (CVar3 == Full) {
    pDVar1 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = (this->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    __dest = (QToolBarAreaLayoutItem *)QArrayData::allocate(&local_38,0x18,0x10,local_48,KeepSize);
    pQVar2 = local_38;
    lVar4 = local_48;
    if (local_48 == 0) {
      lVar4 = 0;
    }
    else {
      memcpy(__dest,(this->d).ptr + local_40,local_48 * 0x18);
    }
    (__return_storage_ptr__->d).d = (Data *)pQVar2;
    (__return_storage_ptr__->d).ptr = __dest;
    (__return_storage_ptr__->d).size = lVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> QList<T>::mid(qsizetype pos, qsizetype len) const
{
    qsizetype p = pos;
    qsizetype l = len;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(d.size, &p, &l)) {
    case QContainerImplHelper::Null:
    case QContainerImplHelper::Empty:
        return QList();
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        break;
    }

    // Allocate memory
    DataPointer copied(l);
    copied->copyAppend(data() + p, data() + p + l);
    return copied;
}